

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O3

DataVariable __thiscall Rml::DataModel::GetVariable(DataModel *this,DataAddress *address)

{
  DataVariable *pDVar1;
  int iVar2;
  size_t sVar3;
  Node *pNVar4;
  pointer pDVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  DataVariable DVar11;
  DataVariable local_38;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pDVar5 = (address->
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar5 != (address->
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    sVar3 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&this->variables,&pDVar5->name);
    pNVar4 = (this->variables).mKeyVals + sVar3;
    if (pNVar4 == (Node *)(this->variables).mInfo) {
      iVar2 = ::std::__cxx11::string::compare
                        ((char *)(address->
                                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (((iVar2 == 0) &&
          (pDVar5 = (address->
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          2 < (ulong)(((long)(address->
                             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar5 >> 3) *
                     -0x3333333333333333))) &&
         (iVar2 = ::std::__cxx11::string::compare((char *)(pDVar5 + 1)), iVar2 == 0)) {
        DVar11 = MakeLiteralIntVariable
                           ((address->
                            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start[2].index);
        auVar10._0_8_ = DVar11.definition;
        auVar10._8_8_ = DVar11.ptr;
        return (DataVariable)auVar10;
      }
    }
    else {
      pDVar1 = &(pNVar4->mData).second;
      local_38 = *pDVar1;
      pDVar5 = (address->
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pDVar1->definition == (VariableDefinition *)0x0 ||
          (int)((ulong)((long)(address->
                              super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar5) >> 3) *
          -0x33333333 < 2) {
        auVar8._0_8_ = pDVar1->definition;
        auVar8._8_8_ = pDVar1->ptr;
        return (DataVariable)auVar8;
      }
      lVar7 = 1;
      lVar6 = 0x28;
      while (local_38 = DataVariable::Child(&local_38,
                                            (DataAddressEntry *)
                                            ((long)&(pDVar5->name)._M_dataplus._M_p + lVar6)),
            local_38.definition != (VariableDefinition *)0x0) {
        lVar7 = lVar7 + 1;
        pDVar5 = (address->
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x28;
        if ((int)((ulong)((long)(address->
                                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar5) >> 3) *
            -0x33333333 <= lVar7) {
          auVar9._0_8_ = local_38.definition;
          auVar9._8_8_ = local_38.ptr;
          return (DataVariable)auVar9;
        }
      }
    }
  }
  return (DataVariable)ZEXT816(0);
}

Assistant:

DataVariable DataModel::GetVariable(const DataAddress& address) const
{
	if (address.empty())
		return DataVariable();

	auto it = variables.find(address.front().name);
	if (it != variables.end())
	{
		DataVariable variable = it->second;

		for (int i = 1; i < (int)address.size() && variable; i++)
		{
			variable = variable.Child(address[i]);
			if (!variable)
				return DataVariable();
		}

		return variable;
	}

	if (address[0].name == "literal")
	{
		if (address.size() > 2 && address[1].name == "int")
			return MakeLiteralIntVariable(address[2].index);
	}

	return DataVariable();
}